

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::AddSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name,char *regex)

{
  pointer pbVar1;
  bool bVar2;
  uint uVar3;
  cmSourceGroup *this_00;
  string *psVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  currentName;
  char *local_1e0;
  string local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  char *local_1a0;
  ulong local_198;
  cmSourceGroup local_190;
  
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = (int)((ulong)((long)(name->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(name->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
  local_1e0 = regex;
  if (-1 < (int)uVar6) {
    local_198 = (ulong)uVar6;
    lVar5 = local_198 * 0x20 + 0x20;
    iVar7 = 0;
    lVar8 = local_198 + 1;
    local_1a0 = regex;
    do {
      pbVar1 = (name->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
                 pbVar1,(long)&(pbVar1->_M_dataplus)._M_p + lVar5);
      this_00 = GetSourceGroup(this,&local_1b8);
      if (this_00 != (cmSourceGroup *)0x0) {
        if (iVar7 == 0) {
          if (local_1a0 != (char *)0x0) {
            cmSourceGroup::SetGroupRegex(this_00,local_1a0);
          }
          goto LAB_001c351f;
        }
        if (lVar8 != 0) {
          uVar3 = (int)local_198 - iVar7;
          goto LAB_001c3430;
        }
        break;
      }
      iVar7 = iVar7 + 1;
      lVar5 = lVar5 + -0x20;
      lVar9 = lVar8 + -1;
      bVar2 = 0 < lVar8;
      lVar8 = lVar9;
    } while (lVar9 != 0 && bVar2);
    std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>::
    emplace_back<std::__cxx11::string_const&,char_const*&>
              ((vector<cmSourceGroup,std::allocator<cmSourceGroup>> *)&this->SourceGroups,
               (name->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,&local_1e0);
    this_00 = GetSourceGroup(this,&local_1b8);
    if (this_00 == (cmSourceGroup *)0x0) {
      cmSystemTools::Error("Could not create source group ",(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      uVar3 = 0;
LAB_001c3430:
      if ((int)uVar6 < (int)uVar3) {
        uVar6 = uVar3;
      }
      lVar5 = ~(ulong)uVar6 + (long)(int)uVar3;
      lVar8 = (long)(int)uVar3 * 0x20;
      while( true ) {
        lVar5 = lVar5 + 1;
        if (lVar5 == 0) break;
        pbVar1 = (name->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        lVar9 = *(long *)((long)&pbVar1[1]._M_dataplus._M_p + lVar8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,lVar9,
                   *(long *)((long)&pbVar1[1]._M_string_length + lVar8) + lVar9);
        psVar4 = cmSourceGroup::GetFullName_abi_cxx11_(this_00);
        cmSourceGroup::cmSourceGroup(&local_190,&local_1d8,(char *)0x0,(psVar4->_M_dataplus)._M_p);
        cmSourceGroup::AddChild(this_00,&local_190);
        cmSourceGroup::~cmSourceGroup(&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        this_00 = cmSourceGroup::LookupChild
                            (this_00,(string *)
                                     ((long)&(name->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[1].
                                             _M_dataplus._M_p + lVar8));
        lVar8 = lVar8 + 0x20;
      }
      cmSourceGroup::SetGroupRegex(this_00,local_1e0);
    }
  }
LAB_001c351f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  return;
}

Assistant:

void cmMakefile::AddSourceGroup(const std::vector<std::string>& name,
                                const char* regex)
{
  cmSourceGroup* sg = nullptr;
  std::vector<std::string> currentName;
  int i = 0;
  const int lastElement = static_cast<int>(name.size() - 1);
  for (i = lastElement; i >= 0; --i) {
    currentName.assign(name.begin(), name.begin() + i + 1);
    sg = this->GetSourceGroup(currentName);
    if (sg != nullptr) {
      break;
    }
  }

  // i now contains the index of the last found component
  if (i == lastElement) {
    // group already exists, replace its regular expression
    if (regex && sg) {
      // We only want to set the regular expression.  If there are already
      // source files in the group, we don't want to remove them.
      sg->SetGroupRegex(regex);
    }
    return;
  }
  if (i == -1) {
    // group does not exist nor belong to any existing group
    // add its first component
    this->SourceGroups.emplace_back(name[0], regex);
    sg = this->GetSourceGroup(currentName);
    i = 0; // last component found
  }
  if (!sg) {
    cmSystemTools::Error("Could not create source group ");
    return;
  }
  // build the whole source group path
  for (++i; i <= lastElement; ++i) {
    sg->AddChild(cmSourceGroup(name[i], nullptr, sg->GetFullName().c_str()));
    sg = sg->LookupChild(name[i]);
  }

  sg->SetGroupRegex(regex);
}